

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::clear_rect(Fl_Text_Display *this,int style,int X,int Y,int width,int height)

{
  Fl_Color FVar1;
  Fl_Color FVar2;
  int iVar3;
  Fl_Text_Display *pFVar4;
  undefined4 local_40;
  undefined4 local_28;
  Fl_Color c;
  int height_local;
  int width_local;
  int Y_local;
  int X_local;
  int style_local;
  Fl_Text_Display *this_local;
  
  if (width != 0) {
    if ((style & 0x400U) == 0) {
      if ((style & 0x800U) == 0) {
        local_28 = Fl_Widget::color((Fl_Widget *)this);
      }
      else {
        pFVar4 = (Fl_Text_Display *)Fl::focus();
        if (pFVar4 == this) {
          FVar1 = Fl_Widget::color((Fl_Widget *)this);
          FVar2 = Fl_Widget::selection_color((Fl_Widget *)this);
          local_28 = fl_color_average(FVar1,FVar2,0.5);
        }
        else {
          FVar1 = Fl_Widget::color((Fl_Widget *)this);
          FVar2 = Fl_Widget::selection_color((Fl_Widget *)this);
          local_28 = fl_color_average(FVar1,FVar2,0.6);
        }
      }
    }
    else {
      pFVar4 = (Fl_Text_Display *)Fl::focus();
      if (pFVar4 == this) {
        local_28 = Fl_Widget::selection_color((Fl_Widget *)this);
      }
      else {
        FVar1 = Fl_Widget::color((Fl_Widget *)this);
        FVar2 = Fl_Widget::selection_color((Fl_Widget *)this);
        local_28 = fl_color_average(FVar1,FVar2,0.4);
      }
    }
    iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar3 == 0) {
      local_40 = fl_inactive(local_28);
    }
    else {
      local_40 = local_28;
    }
    fl_color(local_40);
    fl_rectf(X,Y,width,height);
  }
  return;
}

Assistant:

void Fl_Text_Display::clear_rect(int style,
                                 int X, int Y,
                                 int width, int height) const {
  /* A width of zero means "clear to end of window" to XClearArea */
  if ( width == 0 )
    return;

  Fl_Color c;
  if (style & PRIMARY_MASK) {
    if (Fl::focus()==(Fl_Widget*)this) {
      c = selection_color();
    } else {
      c = fl_color_average(color(), selection_color(), 0.4f);
    }
  } else if (style & HIGHLIGHT_MASK) {
    if (Fl::focus()==(Fl_Widget*)this) {
      c = fl_color_average(color(), selection_color(), 0.5f);
    } else {
      c = fl_color_average(color(), selection_color(), 0.6f);
    }
  } else {
    c = color();
  }
  fl_color(active_r() ? c : fl_inactive(c));
  fl_rectf( X, Y, width, height );
}